

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall
tinyxml2::DynArray<tinyxml2::MemPoolT<72>::Block_*,_10>::EnsureCapacity
          (DynArray<tinyxml2::MemPoolT<72>::Block_*,_10> *this,int cap)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__dest;
  int in_ESI;
  undefined8 *in_RDI;
  Block **newMem;
  int newAllocated;
  
  if (*(int *)(in_RDI + 0xb) < in_ESI) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(in_ESI << 1);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar2);
    memcpy(__dest,(void *)*in_RDI,(long)*(int *)((long)in_RDI + 0x5c) << 3);
    if (((undefined8 *)*in_RDI != in_RDI + 1) && ((void *)*in_RDI != (void *)0x0)) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = __dest;
    *(int *)(in_RDI + 0xb) = in_ESI << 1;
  }
  return;
}

Assistant:

void EnsureCapacity( int cap ) {
        TIXMLASSERT( cap > 0 );
        if ( cap > _allocated ) {
            TIXMLASSERT( cap <= INT_MAX / 2 );
            int newAllocated = cap * 2;
            T* newMem = new T[newAllocated];
            memcpy( newMem, _mem, sizeof(T)*_size );	// warning: not using constructors, only works for PODs
            if ( _mem != _pool ) {
                delete [] _mem;
            }
            _mem = newMem;
            _allocated = newAllocated;
        }
    }